

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O2

void gnns::save_to_file<unsigned_int>(Matrix<unsigned_int> *m,string *file_name)

{
  FILE *__stream;
  GnnsException *this;
  int i;
  uint uVar1;
  allocator local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __stream = fopen((file_name->_M_dataplus)._M_p,"wb");
  if (__stream != (FILE *)0x0) {
    for (uVar1 = 0; uVar1 < m->rows; uVar1 = uVar1 + 1) {
      fwrite(m,4,1,__stream);
      fwrite(m->data + m->cols * uVar1,(ulong)m->cols << 2,1,__stream);
    }
    fclose(__stream);
    return;
  }
  this = (GnnsException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_88,"File ",&local_89);
  std::operator+(&local_68,&local_88,file_name);
  std::operator+(&local_48,&local_68,"is NOT exist!\n");
  GnnsException::GnnsException(this,&local_48);
  __cxa_throw(this,&GnnsException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void save_to_file(const Matrix<T>& m, const std::string& file_name)
    {
        FILE *fp = fopen(file_name.c_str(), "wb");

        if(fp == NULL)
        {
            throw GnnsException(std::string("File ") + file_name + "is NOT exist!\n");
        }

        for(int i=0;i<m.rows;++i)
        {
            //write the dim
            fwrite(&m.cols, 4, 1, fp);
            //write the row data
            fwrite(m[i], sizeof(T)*m.cols, 1, fp);
        }

        fclose(fp);
    }